

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.cpp
# Opt level: O2

void __thiscall TasGrid::GridFourier::differentiate(GridFourier *this,double *x,double *jacobian)

{
  uint uVar1;
  size_t sVar2;
  int j;
  ulong uVar3;
  pointer piVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_type __n;
  ulong uVar8;
  double *pdVar9;
  vector<double,_std::allocator<double>_> wimag;
  vector<double,_std::allocator<double>_> wreal;
  allocator_type local_91;
  size_type local_90;
  pointer local_88;
  size_t local_80;
  long local_78;
  double *local_70;
  ulong local_68;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  __n = (size_type)(this->super_BaseCanonicalGrid).points.cache_num_indexes;
  local_48._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
  local_70 = jacobian;
  ::std::__fill_n_a<double*,int,double>
            (jacobian,(this->super_BaseCanonicalGrid).num_dimensions *
                      (this->super_BaseCanonicalGrid).num_outputs);
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,__n,(allocator_type *)&local_60);
  local_90 = __n;
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_60,__n,&local_91);
  computeBasis<double,false>
            (this,&(this->super_BaseCanonicalGrid).points,x,
             local_48._M_impl.super__Vector_impl_data._M_start,
             local_60._M_impl.super__Vector_impl_data._M_start);
  sVar2 = (this->super_BaseCanonicalGrid).points.num_dimensions;
  piVar4 = (this->super_BaseCanonicalGrid).points.indexes.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  local_80 = (this->fourier_coefs).stride;
  local_88 = (this->fourier_coefs).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar1 = (this->super_BaseCanonicalGrid).num_outputs;
  uVar7 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar7;
  }
  local_68 = 0;
  if (0 < (int)local_90) {
    local_68 = local_90 & 0xffffffff;
  }
  local_78 = sVar2 * 4;
  for (; uVar7 != local_68; uVar7 = uVar7 + 1) {
    uVar1 = (this->super_BaseCanonicalGrid).num_dimensions;
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    pdVar9 = local_70;
    for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        pdVar9[uVar3] =
             (local_60._M_impl.super__Vector_impl_data._M_start[uVar7] *
              local_88[local_80 * uVar7 + uVar8] +
             local_48._M_impl.super__Vector_impl_data._M_start[uVar7] *
             local_88[(local_90 + uVar7) * local_80 + uVar8]) *
             (double)(int)(-(piVar4[uVar3] & 1U) ^ piVar4[uVar3]) * -3.141592653589793 +
             pdVar9[uVar3];
      }
      pdVar9 = pdVar9 + (int)uVar1;
    }
    piVar4 = piVar4 + sVar2;
  }
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void GridFourier::differentiate(const double x[], double jacobian[]) const {
    /* From GridFourier::evaluate(), the contribution of a particular point/tensor to the surrogate model at a point x is
     *
     *     p(x) := Re[w] * Re[exp(c*x*I)] - Im[w] * Im[exp(c*x*I)],
     *
     * where w is a complex scalar, c is a real scalar, and I^2 = -1. Hence, the derivative is
     *
     *     p'(x) := -c * ( Re[w] * Im[exp(c*x*I)] + Im[w] * Re[exp(c*x*I)] ).
     */
    int num_points = points.getNumIndexes();
    std::fill_n(jacobian, num_outputs * num_dimensions, 0.0);
    std::vector<double> wreal(num_points), wimag(num_points);
    computeBasis<double, false>(points, x, wreal.data(), wimag.data());
    for(int i=0; i<num_points; i++) {
        const int *p = points.getIndex(i);
        const double *fcreal = fourier_coefs.getStrip(i);
        const double *fcimag = fourier_coefs.getStrip(i + num_points);
        for(int k=0; k<num_outputs; k++) {
            for(int j=0; j<num_dimensions; j++) {
                double phase = Maths::pi * (double) (p[j] % 2 == 0 ? p[j] : -p[j]-1);
                jacobian[k * num_dimensions + j] += -phase * (wimag[i] * fcreal[k] + wreal[i] * fcimag[k]);
            }
        }
    }
}